

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multilayer_metadata.cc
# Opt level: O1

double libaom_examples::depth_representation_element_to_double(DepthRepresentationElement *e)

{
  bool bVar1;
  uint uVar2;
  double dVar3;
  
  if (e->exponent == 0) {
    uVar2 = -e->mantissa;
    if (e->sign_flag == false) {
      uVar2 = e->mantissa;
    }
    dVar3 = ldexp(1.0,e->mantissa_len - 0x1e);
    dVar3 = dVar3 * (double)uVar2;
  }
  else {
    bVar1 = e->sign_flag;
    dVar3 = ldexp(1.0,e->exponent - 0x1f);
    if (bVar1 != false) {
      dVar3 = -dVar3;
    }
    dVar3 = ((double)e->mantissa / (double)(1L << (e->mantissa_len & 0x3f)) + 1.0) * dVar3;
  }
  return dVar3;
}

Assistant:

double depth_representation_element_to_double(
    const DepthRepresentationElement &e) {
  // Let x be a variable that is computed using four variables s, e, m, and n,
  // as follows: If e is greater than 0 and less than 127, x is set equal to
  // (−1)^s*2^(e−31) * (1+m÷2^n).
  // Otherwise (e is equal to 0), x is set equal to (−1)^s*2^−(30+n)*m.
  if (e.exponent > 0) {
    return (e.sign_flag ? -1 : 1) * std::pow(2.0, e.exponent - 31) *
           (1 + static_cast<double>(e.mantissa) /
                    (static_cast<int64_t>(1) << e.mantissa_len));
  } else {
    return (e.sign_flag ? -1 : 1) * e.mantissa *
           std::pow(2.0, -30 + e.mantissa_len);
  }
}